

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::testCase(FunctionalTest20_21 *this,GLuint *bit_field)

{
  bool bVar1;
  RenderContext *pRVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  MessageBuilder local_288;
  uint local_108;
  uint local_104;
  GLuint i_3;
  GLuint i_2;
  GLuint i_1;
  GLuint i;
  subroutineUniformSet subroutine_indices [5];
  undefined1 local_88 [8];
  subroutineUniformSet captured_subroutine_indices [5];
  GLuint *bit_field_local;
  FunctionalTest20_21 *this_local;
  
  unique0x1000077b = bit_field;
  for (i_2 = 0; i_2 < 5; i_2 = i_2 + 1) {
    subroutineUniformSet::set
              ((subroutineUniformSet *)(&i_1 + (ulong)i_2 * 5),stack0xffffffffffffffe0[i_2],
               this->m_subroutine_indices);
  }
  for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
    (*this->m_shared_contexts[i_3]->_vptr_RenderContext[8])();
    updateCurrentSubroutineSet(this,(subroutineUniformSet *)(&i_1 + (ulong)i_3 * 5));
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  (*pRVar2->_vptr_RenderContext[8])();
  updateCurrentSubroutineSet
            (this,(subroutineUniformSet *)&subroutine_indices[3].m_geometry_shader_stage);
  for (local_104 = 0; local_104 < 4; local_104 = local_104 + 1) {
    (*this->m_shared_contexts[local_104]->_vptr_RenderContext[8])();
    captureCurrentSubroutineSet(this,(subroutineUniformSet *)(local_88 + (ulong)local_104 * 0x14));
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  (*pRVar2->_vptr_RenderContext[8])();
  captureCurrentSubroutineSet
            (this,(subroutineUniformSet *)&captured_subroutine_indices[3].m_geometry_shader_stage);
  local_108 = 0;
  while( true ) {
    if (4 < local_108) {
      return true;
    }
    bVar1 = subroutineUniformSet::operator!=
                      ((subroutineUniformSet *)(&i_1 + (ulong)local_108 * 5),
                       (subroutineUniformSet *)(local_88 + (ulong)local_108 * 0x14));
    if (bVar1) break;
    local_108 = local_108 + 1;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_288,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_288,(char (*) [7])"Error.");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])" Context: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_108);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])" VS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&i_1 + (ulong)local_108 * 5);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])" captured: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)(local_88 + (ulong)local_108 * 0x14));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" TCS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&subroutine_indices[(ulong)local_108 - 1].m_fragment_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])" captured: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&captured_subroutine_indices[(ulong)local_108 - 1].
                              m_fragment_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" TES, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&subroutine_indices[local_108].m_vertex_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])" captured: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&captured_subroutine_indices[local_108].m_vertex_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])" GS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&subroutine_indices[local_108].m_tesselation_control_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])" captured: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&captured_subroutine_indices[local_108].
                              m_tesselation_control_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])" FS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&subroutine_indices[local_108].m_tesselation_evaluation_shader_stage);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])" captured: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,&captured_subroutine_indices[local_108].
                              m_tesselation_evaluation_shader_stage);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_288);
  return false;
}

Assistant:

bool FunctionalTest20_21::testCase(const glw::GLuint bit_field[5])
{
	/* Storage for subroutine indices */
	subroutineUniformSet captured_subroutine_indices[m_n_shared_contexts + 1];
	subroutineUniformSet subroutine_indices[m_n_shared_contexts + 1];

	/* Prepare subroutine_indices with bit fields */
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		subroutine_indices[i].set(bit_field[i], m_subroutine_indices);
	};

	/* Update subroutine uniforms, each context gets different set */
	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i]->makeCurrent();
		updateCurrentSubroutineSet(subroutine_indices[i]);
	}

	m_context.getRenderContext().makeCurrent();
	updateCurrentSubroutineSet(subroutine_indices[m_n_shared_contexts]);

	/* Capture subroutine uniforms */
	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i]->makeCurrent();
		captureCurrentSubroutineSet(captured_subroutine_indices[i]);
	}

	m_context.getRenderContext().makeCurrent();
	captureCurrentSubroutineSet(captured_subroutine_indices[m_n_shared_contexts]);

	/* Verify that captured uniforms match expected values */
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		if (subroutine_indices[i] != captured_subroutine_indices[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error."
				<< " Context: " << i << " VS, expected: " << subroutine_indices[i].m_vertex_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_vertex_shader_stage
				<< " TCS, expected: " << subroutine_indices[i].m_tesselation_control_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_tesselation_control_shader_stage
				<< " TES, expected: " << subroutine_indices[i].m_tesselation_evaluation_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_tesselation_evaluation_shader_stage
				<< " GS, expected: " << subroutine_indices[i].m_geometry_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_geometry_shader_stage
				<< " FS, expected: " << subroutine_indices[i].m_fragment_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_fragment_shader_stage << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}